

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

double __thiscall ON_DimStyle::TextWidthOfEmSpace(ON_DimStyle *this)

{
  double dVar1;
  
  dVar1 = TextAdvanceOfCodePoint(this,0x2003);
  if (dVar1 <= 0.0) {
    dVar1 = TextAdvanceOfCodePoint(this,0x4d);
    if (dVar1 <= 0.0) {
      dVar1 = TextAdvanceOfCodePoint(this,0x2002);
      dVar1 = dVar1 + dVar1;
      if (dVar1 <= 0.0) {
        dVar1 = TextAdvanceOfCodePoint(this,0x4e);
        dVar1 = dVar1 + dVar1;
        if (dVar1 <= 0.0) {
          dVar1 = TextAdvanceOfCodePoint(this,0x20);
          dVar1 = dVar1 * 4.0;
          if (dVar1 <= 0.0) {
            dVar1 = this->m_textheight * 1.5;
          }
        }
      }
    }
  }
  return dVar1;
}

Assistant:

double ON_DimStyle::TextWidthOfEmSpace() const
{
  // This is the fundamental WidthOfXSpace() function.
  // Other WidthOfXSpace() functions call TextWidthOfEmSpace() when TextAdvanceOfCodePoint(obvious code point) fails.
  // This function may only call TextAdvanceOfCodePoint() and TextHeight().
  double w = TextAdvanceOfCodePoint(ON_UnicodeCodePoint::ON_EmSpace);
  if (false == w > 0.0)
  {
    w = TextAdvanceOfCodePoint('M');
    if (false == w > 0.0)
    {
      w = 2.0 * TextAdvanceOfCodePoint(ON_UnicodeCodePoint::ON_EnSpace);
      if (false == w > 0.0)
      {
        w = 2.0 * TextAdvanceOfCodePoint('N');
        if (false == w > 0.0)
        {
          w = 4.0 * TextAdvanceOfCodePoint(ON_UnicodeCodePoint::ON_Space);
          if (false == w > 0.0)
            w = 1.5 * TextHeight();
        }
      }
    }
  }
  return w;
}